

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer_by_key
          (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,per_timer_data *timer,op_queue<asio::detail::scheduler_operation> *ops,
          void *cancellation_key)

{
  wait_op *pwVar1;
  wait_op *pwVar2;
  wait_op *pwVar3;
  wait_op *tmp;
  op_queue<asio::detail::wait_op> other_ops;
  op_queue<asio::detail::wait_op> local_38;
  
  if ((timer->prev_ != (per_timer_data *)0x0) || (this->timers_ == timer)) {
    local_38.front_ = (wait_op *)0x0;
    local_38.back_ = (wait_op *)0x0;
    do {
      pwVar3 = (timer->op_queue_).front_;
      if (pwVar3 == (wait_op *)0x0) break;
      pwVar1 = (wait_op *)(pwVar3->super_operation).next_;
      (timer->op_queue_).front_ = pwVar1;
      if (pwVar1 == (wait_op *)0x0) {
        (timer->op_queue_).back_ = (wait_op *)0x0;
      }
      (pwVar3->super_operation).next_ = (scheduler_operation *)0x0;
      if (pwVar3->cancellation_key_ == cancellation_key) {
        std::error_code::operator=(&pwVar3->ec_,operation_aborted);
        (pwVar3->super_operation).next_ = (scheduler_operation *)0x0;
        pwVar1 = local_38.front_;
        pwVar2 = local_38.back_;
        if (ops->back_ == (scheduler_operation *)0x0) {
          ops->back_ = &pwVar3->super_operation;
          ops->front_ = &pwVar3->super_operation;
        }
        else {
          ops->back_->next_ = &pwVar3->super_operation;
          ops->back_ = &pwVar3->super_operation;
        }
      }
      else {
        (pwVar3->super_operation).next_ = (scheduler_operation *)0x0;
        pwVar1 = pwVar3;
        pwVar2 = pwVar3;
        if (local_38.back_ != (wait_op *)0x0) {
          ((local_38.back_)->super_operation).next_ = &pwVar3->super_operation;
          pwVar1 = local_38.front_;
        }
      }
      local_38.back_ = pwVar2;
      local_38.front_ = pwVar1;
    } while (pwVar3 != (wait_op *)0x0);
    if (local_38.front_ != (wait_op *)0x0) {
      pwVar3 = (timer->op_queue_).back_;
      if (pwVar3 == (wait_op *)0x0) {
        pwVar3 = (wait_op *)timer;
      }
      (pwVar3->super_operation).next_ = &(local_38.front_)->super_operation;
      (timer->op_queue_).back_ = local_38.back_;
      local_38.front_ = (wait_op *)0x0;
      local_38.back_ = (wait_op *)0x0;
    }
    if ((timer->op_queue_).front_ == (wait_op *)0x0) {
      remove_timer(this,timer);
    }
    op_queue<asio::detail::wait_op>::~op_queue(&local_38);
  }
  return;
}

Assistant:

void cancel_timer_by_key(per_timer_data* timer,
      op_queue<operation>& ops, void* cancellation_key)
  {
    if (timer->prev_ != 0 || timer == timers_)
    {
      op_queue<wait_op> other_ops;
      while (wait_op* op = timer->op_queue_.front())
      {
        timer->op_queue_.pop();
        if (op->cancellation_key_ == cancellation_key)
        {
          op->ec_ = asio::error::operation_aborted;
          ops.push(op);
        }
        else
          other_ops.push(op);
      }
      timer->op_queue_.push(other_ops);
      if (timer->op_queue_.empty())
        remove_timer(*timer);
    }
  }